

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

void __thiscall
Js::LiteralStringWithPropertyStringPtr::CachePropertyRecordImpl
          (LiteralStringWithPropertyStringPtr *this,PropertyRecord *propertyRecord)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  undefined4 *puVar4;
  
  Memory::Recycler::WBSetBit((char *)&this->propertyRecord);
  (this->propertyRecord).ptr = propertyRecord;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->propertyRecord);
  cVar3 = JavascriptString::GetLength((JavascriptString *)this);
  if (cVar3 != propertyRecord->byteCount >> 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0xbd,"(this->GetLength() == propertyRecord->GetLength())",
                                "this->GetLength() == propertyRecord->GetLength()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  JavascriptString::SetBuffer((JavascriptString *)this,(char16 *)(propertyRecord + 1));
  return;
}

Assistant:

void LiteralStringWithPropertyStringPtr::CachePropertyRecordImpl(_In_ PropertyRecord const* propertyRecord)
    {
        this->propertyRecord = propertyRecord;
        Assert(this->GetLength() == propertyRecord->GetLength());

        // PropertyRecord has its own copy of the string content, so we can drop the reference to our old copy.
        // This is okay because the PropertyRecord pointer will keep the data alive.
        this->SetBuffer(propertyRecord->GetBuffer());
    }